

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bag.cpp
# Opt level: O0

void __thiscall minibag::Bag::startWritingChunk(Bag *this,Time time)

{
  uint64_t uVar1;
  undefined8 in_RSI;
  long in_RDI;
  CompressionType in_stack_0000005c;
  ChunkedFile *in_stack_00000060;
  uint32_t in_stack_000000e4;
  uint32_t in_stack_000000e8;
  CompressionType in_stack_000000ec;
  Bag *in_stack_000000f0;
  
  uVar1 = ChunkedFile::getOffset((ChunkedFile *)(in_RDI + 8));
  *(uint64_t *)(in_RDI + 200) = uVar1;
  *(undefined8 *)(in_RDI + 0xb8) = in_RSI;
  *(undefined8 *)(in_RDI + 0xc0) = in_RSI;
  writeChunkHeader(in_stack_000000f0,in_stack_000000ec,in_stack_000000e8,in_stack_000000e4);
  ChunkedFile::setWriteMode(in_stack_00000060,in_stack_0000005c);
  uVar1 = ChunkedFile::getOffset((ChunkedFile *)(in_RDI + 8));
  *(uint64_t *)(in_RDI + 0x100) = uVar1;
  *(undefined1 *)(in_RDI + 0xb0) = 1;
  return;
}

Assistant:

void Bag::startWritingChunk(Time time) {
    // Initialize chunk info
    curr_chunk_info_.pos        = file_.getOffset();
    curr_chunk_info_.start_time = time;
    curr_chunk_info_.end_time   = time;

    // Write the chunk header, with a place-holder for the data sizes (we'll fill in when the chunk is finished)
    writeChunkHeader(compression_, 0, 0);

    // Turn on compressed writing
    file_.setWriteMode(compression_);
    
    // Record where the data section of this chunk started
    curr_chunk_data_pos_ = file_.getOffset();

    chunk_open_ = true;
}